

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int yaml_parser_parse_flow_mapping_value(yaml_parser_t *parser,yaml_event_t *event,int empty)

{
  size_t sVar1;
  yaml_parser_state_t *pyVar2;
  size_t sVar3;
  size_t sVar4;
  int iVar5;
  yaml_token_t *pyVar6;
  yaml_char_t *pyVar7;
  int iVar8;
  
  if ((parser->token_available == 0) && (iVar5 = yaml_parser_fetch_more_tokens(parser), iVar5 == 0))
  {
    pyVar6 = (yaml_token_t *)0x0;
  }
  else {
    pyVar6 = (parser->tokens).head;
  }
  if (pyVar6 == (yaml_token_t *)0x0) {
    return 0;
  }
  if ((empty == 0) && (pyVar6->type == YAML_VALUE_TOKEN)) {
    parser->token_available = 0;
    parser->tokens_parsed = parser->tokens_parsed + 1;
    pyVar6 = (parser->tokens).head;
    parser->stream_end_produced = (uint)(pyVar6->type == YAML_STREAM_END_TOKEN);
    (parser->tokens).head = pyVar6 + 1;
    iVar5 = yaml_parser_fetch_more_tokens(parser);
    iVar8 = 0;
    if (iVar5 == 0) {
      pyVar6 = (yaml_token_t *)0x0;
    }
    else {
      pyVar6 = (parser->tokens).head;
    }
    if (pyVar6 == (yaml_token_t *)0x0) {
      return 0;
    }
    if ((pyVar6->type | YAML_STREAM_END_TOKEN) != YAML_FLOW_ENTRY_TOKEN) {
      if (((parser->states).top != (parser->states).end) ||
         (iVar5 = yaml_stack_extend(&(parser->states).start,&(parser->states).top,
                                    &(parser->states).end), iVar5 != 0)) {
        pyVar2 = (parser->states).top;
        (parser->states).top = pyVar2 + 1;
        *pyVar2 = YAML_PARSE_FLOW_MAPPING_KEY_STATE;
        iVar5 = yaml_parser_parse_node(parser,event,0,0);
        return iVar5;
      }
      goto LAB_001b198e;
    }
  }
  parser->state = YAML_PARSE_FLOW_MAPPING_KEY_STATE;
  sVar1 = (pyVar6->start_mark).column;
  sVar3 = (pyVar6->start_mark).index;
  sVar4 = (pyVar6->start_mark).line;
  pyVar7 = (yaml_char_t *)yaml_malloc(1);
  if (pyVar7 == (yaml_char_t *)0x0) {
    iVar8 = 0;
  }
  else {
    *pyVar7 = '\0';
    *(undefined8 *)event = 0;
    (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
    (event->end_mark).column = 0;
    (event->end_mark).index = 0;
    (event->end_mark).line = 0;
    (event->start_mark).line = 0;
    (event->start_mark).column = 0;
    *(undefined8 *)((long)&event->data + 0x28) = 0;
    (event->start_mark).index = 0;
    (event->data).scalar.length = 0;
    *(undefined8 *)((long)&event->data + 0x20) = 0;
    (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
    (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
    parser = (yaml_parser_t *)&(event->data).scalar.style;
    event->type = YAML_SCALAR_EVENT;
    (event->start_mark).index = sVar3;
    (event->start_mark).line = sVar4;
    (event->start_mark).column = sVar1;
    (event->end_mark).index = sVar3;
    (event->end_mark).line = sVar4;
    (event->end_mark).column = sVar1;
    (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
    (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
    (event->data).scalar.value = pyVar7;
    (event->data).scalar.length = 0;
    *(undefined8 *)((long)&event->data + 0x20) = 1;
    iVar8 = 1;
  }
LAB_001b198e:
  parser->error = YAML_PLAIN_SCALAR_STYLE;
  return iVar8;
}

Assistant:

static int
yaml_parser_parse_flow_mapping_value(yaml_parser_t *parser,
        yaml_event_t *event, int empty)
{
    yaml_token_t *token;

    token = PEEK_TOKEN(parser);
    if (!token) return 0;

    if (empty) {
        parser->state = YAML_PARSE_FLOW_MAPPING_KEY_STATE;
        return yaml_parser_process_empty_scalar(parser, event,
                token->start_mark);
    }

    if (token->type == YAML_VALUE_TOKEN) {
        SKIP_TOKEN(parser);
        token = PEEK_TOKEN(parser);
        if (!token) return 0;
        if (token->type != YAML_FLOW_ENTRY_TOKEN
                && token->type != YAML_FLOW_MAPPING_END_TOKEN) {
            if (!PUSH(parser, parser->states,
                        YAML_PARSE_FLOW_MAPPING_KEY_STATE))
                return 0;
            return yaml_parser_parse_node(parser, event, 0, 0);
        }
    }

    parser->state = YAML_PARSE_FLOW_MAPPING_KEY_STATE;
    return yaml_parser_process_empty_scalar(parser, event, token->start_mark);
}